

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O2

void canvas_reload(t_symbol *name,t_symbol *dir,_glist *except)

{
  _instancecanvas *p_Var1;
  int oldstate;
  _binbuf *p_Var2;
  _glist *gl;
  _instanceeditor *p_Var3;
  
  oldstate = canvas_suspend_dsp();
  if (*(_binbuf **)(pd_maininstance.pd_gui)->i_editor == (_binbuf *)0x0) {
    p_Var2 = (_binbuf *)0x0;
  }
  else {
    p_Var2 = binbuf_duplicate(*(_binbuf **)(pd_maininstance.pd_gui)->i_editor);
  }
  (pd_maininstance.pd_gui)->i_reloadingabstraction = except;
  for (gl = pd_getcanvaslist(); p_Var1 = pd_maininstance.pd_gui, gl != (_glist *)0x0;
      gl = gl->gl_next) {
    glist_doreload(gl,name,dir,(t_gobj *)except);
  }
  (pd_maininstance.pd_gui)->i_reloadingabstraction = (_glist *)0x0;
  if (p_Var2 != (_binbuf *)0x0) {
    p_Var3 = p_Var1->i_editor;
    if (*(_binbuf **)p_Var3 != (_binbuf *)0x0) {
      binbuf_free(*(_binbuf **)p_Var3);
      p_Var3 = (pd_maininstance.pd_gui)->i_editor;
    }
    *(_binbuf **)p_Var3 = p_Var2;
  }
  canvas_resume_dsp(oldstate);
  return;
}

Assistant:

void canvas_reload(t_symbol *name, t_symbol *dir, t_glist *except)
{
    t_canvas *x;
    int dspwas = canvas_suspend_dsp();
    t_binbuf*b = 0;
    if(EDITOR->copy_binbuf)
        b = binbuf_duplicate(EDITOR->copy_binbuf);

    THISGUI->i_reloadingabstraction = except;
        /* find all root canvases */
    for (x = pd_getcanvaslist(); x; x = x->gl_next)
        glist_doreload(x, name, dir, &except->gl_gobj);
    THISGUI->i_reloadingabstraction = 0;
    if(b)
    {
        if(EDITOR->copy_binbuf)
            binbuf_free(EDITOR->copy_binbuf);
        EDITOR->copy_binbuf = b;
    }
    canvas_resume_dsp(dspwas);
}